

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::put
          (ZoneStringsLoader *this,char *key,ResourceValue *value,UBool noFallback,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int i;
  ResourceTable timeZonesTable;
  char *local_60;
  ResourceTable local_58;
  
  local_60 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,status);
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = ResourceTable::getKeyAndValue(&local_58,0,&local_60,value), UVar1 != '\0')) {
    i = 1;
    do {
      iVar2 = (*(value->super_UObject)._vptr_UObject[3])(value);
      if (iVar2 == 2) {
        consumeNamesTable(this,local_60,value,noFallback,status);
      }
      if (U_ZERO_ERROR < *status) {
        return;
      }
      UVar1 = ResourceTable::getKeyAndValue(&local_58,i,&local_60,value);
      i = i + 1;
    } while (UVar1 != '\0');
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool noFallback,
            UErrorCode &status) {
        ResourceTable timeZonesTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; timeZonesTable.getKeyAndValue(i, key, value); ++i) {
            U_ASSERT(!value.isNoInheritanceMarker());
            if (value.getType() == URES_TABLE) {
                consumeNamesTable(key, value, noFallback, status);
            } else {
                // Ignore fields that aren't tables (e.g., fallbackFormat and regionFormatStandard).
                // All time zone fields are tables.
            }
            if (U_FAILURE(status)) { return; }
        }
    }